

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack4.h
# Opt level: O1

void ncnn::padding_reflect_pack4_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  puVar3 = (undefined8 *)((long)(src->w * top * 4) * 4 + (long)src->data);
  puVar6 = (undefined8 *)dst->data;
  uVar7 = (ulong)(uint)left;
  uVar8 = (ulong)(uint)right;
  if (0 < top) {
    iVar5 = 0;
    do {
      lVar10 = uVar7 << 4;
      if (0 < left) {
        do {
          uVar2 = ((undefined8 *)((long)puVar3 + lVar10))[1];
          *puVar6 = *(undefined8 *)((long)puVar3 + lVar10);
          puVar6[1] = uVar2;
          puVar6 = puVar6 + 2;
          lVar10 = lVar10 + -0x10;
        } while (lVar10 != 0);
      }
      puVar4 = puVar3;
      if (0 < src->w) {
        iVar9 = 0;
        do {
          uVar2 = puVar4[1];
          *puVar6 = *puVar4;
          puVar6[1] = uVar2;
          puVar4 = puVar4 + 2;
          puVar6 = puVar6 + 2;
          iVar9 = iVar9 + 1;
        } while (iVar9 < src->w);
      }
      if (0 < right) {
        lVar10 = -0x20;
        do {
          uVar2 = ((undefined8 *)((long)puVar4 + lVar10))[1];
          *puVar6 = *(undefined8 *)((long)puVar4 + lVar10);
          puVar6[1] = uVar2;
          puVar6 = puVar6 + 2;
          lVar1 = uVar8 * 0x10 + lVar10;
          lVar10 = lVar10 + -0x10;
        } while (lVar1 != -0x10);
      }
      puVar3 = puVar3 + (long)src->w * -2;
      iVar5 = iVar5 + 1;
    } while (iVar5 != top);
  }
  if (0 < src->h) {
    iVar5 = 0;
    do {
      lVar10 = uVar7 << 4;
      if (0 < left) {
        do {
          uVar2 = ((undefined8 *)((long)puVar3 + lVar10))[1];
          *puVar6 = *(undefined8 *)((long)puVar3 + lVar10);
          puVar6[1] = uVar2;
          puVar6 = puVar6 + 2;
          lVar10 = lVar10 + -0x10;
        } while (lVar10 != 0);
      }
      if (0 < src->w) {
        iVar9 = 0;
        do {
          uVar2 = puVar3[1];
          *puVar6 = *puVar3;
          puVar6[1] = uVar2;
          puVar3 = puVar3 + 2;
          puVar6 = puVar6 + 2;
          iVar9 = iVar9 + 1;
        } while (iVar9 < src->w);
      }
      if (0 < right) {
        lVar10 = -0x20;
        do {
          uVar2 = ((undefined8 *)((long)puVar3 + lVar10))[1];
          *puVar6 = *(undefined8 *)((long)puVar3 + lVar10);
          puVar6[1] = uVar2;
          puVar6 = puVar6 + 2;
          lVar1 = uVar8 * 0x10 + lVar10;
          lVar10 = lVar10 + -0x10;
        } while (lVar1 != -0x10);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < src->h);
  }
  if (0 < bottom) {
    puVar3 = puVar3 + (long)src->w * -4;
    iVar5 = 0;
    do {
      lVar10 = uVar7 << 4;
      if (0 < left) {
        do {
          uVar2 = ((undefined8 *)((long)puVar3 + lVar10))[1];
          *puVar6 = *(undefined8 *)((long)puVar3 + lVar10);
          puVar6[1] = uVar2;
          puVar6 = puVar6 + 2;
          lVar10 = lVar10 + -0x10;
        } while (lVar10 != 0);
      }
      puVar4 = puVar3;
      if (0 < src->w) {
        iVar9 = 0;
        do {
          uVar2 = puVar4[1];
          *puVar6 = *puVar4;
          puVar6[1] = uVar2;
          puVar4 = puVar4 + 2;
          puVar6 = puVar6 + 2;
          iVar9 = iVar9 + 1;
        } while (iVar9 < src->w);
      }
      if (0 < right) {
        lVar10 = -0x20;
        do {
          uVar2 = ((undefined8 *)((long)puVar4 + lVar10))[1];
          *puVar6 = *(undefined8 *)((long)puVar4 + lVar10);
          puVar6[1] = uVar2;
          puVar6 = puVar6 + 2;
          lVar1 = uVar8 * 0x10 + lVar10;
          lVar10 = lVar10 + -0x10;
        } while (lVar1 != -0x10);
      }
      puVar3 = puVar3 + (long)src->w * -2;
      iVar5 = iVar5 + 1;
    } while (iVar5 != bottom);
  }
  return;
}

Assistant:

static void padding_reflect_pack4_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    ptr += top * src.w * 4;
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill bottom
    ptr -= 2 * src.w * 4;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
}